

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compat.hpp
# Opt level: O0

string * toml::cxx::to_string_abi_cxx11_(source_location *loc)

{
  source_location *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char *fname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined8 in_stack_fffffffffffffe58;
  uint uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  allocator<char> local_141 [72];
  allocator<char> local_f9 [40];
  allocator<char> local_d1 [88];
  allocator<char> local_79 [97];
  char *local_18;
  source_location *local_10;
  
  uVar1 = (uint)((ulong)in_stack_fffffffffffffe58 >> 0x20);
  __lhs = in_RDI;
  local_10 = in_RSI;
  local_18 = std::source_location::file_name(in_RSI);
  if (local_18 == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe70,(char *)__lhs,(allocator<char> *)in_RDI);
    std::source_location::line(local_10);
    std::__cxx11::to_string(uVar1);
    std::operator+(__lhs,in_RDI);
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &stack0xfffffffffffffe77;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe70,(char *)__lhs,(allocator<char> *)in_RDI);
    std::operator+(__lhs,in_RDI);
    std::__cxx11::string::~string(this);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe77);
    std::__cxx11::string::~string(this);
    std::__cxx11::string::~string(this);
    std::__cxx11::string::~string(this);
    std::allocator<char>::~allocator(local_141);
  }
  else {
    uVar1 = (uint)((ulong)local_79 >> 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe70,(char *)__lhs,(allocator<char> *)in_RDI);
    std::source_location::line(local_10);
    std::__cxx11::to_string(uVar1);
    std::operator+(__lhs,in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe70,(char *)__lhs,(allocator<char> *)in_RDI);
    std::operator+(__lhs,in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe70,(char *)__lhs,(allocator<char> *)in_RDI);
    std::operator+(__lhs,in_RDI);
    std::__cxx11::string::~string(in_stack_fffffffffffffe30);
    std::allocator<char>::~allocator(local_f9);
    std::__cxx11::string::~string(in_stack_fffffffffffffe30);
    std::__cxx11::string::~string(in_stack_fffffffffffffe30);
    std::allocator<char>::~allocator(local_d1);
    std::__cxx11::string::~string(in_stack_fffffffffffffe30);
    std::__cxx11::string::~string(in_stack_fffffffffffffe30);
    std::__cxx11::string::~string(in_stack_fffffffffffffe30);
    std::allocator<char>::~allocator(local_79);
  }
  return (string *)__lhs;
}

Assistant:

inline std::string to_string(const source_location& loc)
{
    const char* fname = loc.file_name();
    if(fname)
    {
        return std::string(" at line ") + std::to_string(loc.line()) +
               std::string(" in file ") + std::string(fname);
    }
    else
    {
        return std::string(" at line ") + std::to_string(loc.line()) +
               std::string(" in unknown file");
    }
}